

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O1

void __thiscall
qclab::qgates::QGate2<double>::apply
          (QGate2<double> *this,Side side,Op op,int nbQubits,SquareMatrix<double> *matrix,int offset
          )

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  double *pdVar5;
  _Head_base<0UL,_double_*,_false> _Var6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  char *__assertion;
  double *pdVar12;
  long lVar13;
  double *pdVar14;
  int64_t k;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  double dVar23;
  SquareMatrix<double> mat2;
  vector<int,_std::allocator<int>_> qubits;
  SquareMatrix<double> local_b0;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  int local_74;
  SquareMatrix<double> local_70;
  SquareMatrix<double> local_60;
  int *local_50 [2];
  long local_40;
  long local_38;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x23,
                  "virtual void qclab::qgates::QGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x24,
                  "virtual void qclab::qgates::QGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  (*(this->super_QObject<double>)._vptr_QObject[5])(local_50,this);
  iVar4 = *local_50[0] + offset;
  *local_50[0] = iVar4;
  iVar18 = offset + local_50[0][1];
  local_50[0][1] = iVar18;
  if (iVar4 < nbQubits) {
    if (iVar18 < nbQubits) {
      if (iVar4 + 1 != iVar18) {
        __assert_fail("qubits[0] + 1 == qubits[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                      ,0x29,
                      "virtual void qclab::qgates::QGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                     );
      }
      (*(this->super_QObject<double>)._vptr_QObject[7])(&local_b0);
      if ((op != NoTrans) && (1 < local_b0.size_)) {
        pdVar5 = (double *)
                 ((long)local_b0.data_._M_t.
                        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                        super__Head_base<0UL,_double_*,_false>._M_head_impl + local_b0.size_ * 8);
        _Var6._M_head_impl = (double *)local_b0.data_;
        lVar8 = 0;
        do {
          lVar15 = 1;
          pdVar7 = pdVar5;
          do {
            dVar23 = _Var6._M_head_impl[lVar15];
            _Var6._M_head_impl[lVar15] = *pdVar7;
            *pdVar7 = dVar23;
            lVar13 = lVar8 + lVar15;
            lVar15 = lVar15 + 1;
            pdVar7 = pdVar7 + local_b0.size_;
          } while (lVar13 + 1 < local_b0.size_);
          pdVar5 = pdVar5 + local_b0.size_ + 1;
          _Var6._M_head_impl = _Var6._M_head_impl + local_b0.size_ + 1;
          bVar22 = lVar8 != local_b0.size_ + -2;
          lVar8 = lVar8 + 1;
        } while (bVar22);
      }
      if (side == Left) {
        if (nbQubits == 2) {
          lVar8 = matrix->size_;
          if (lVar8 != local_b0.size_) {
            __assert_fail("size_ == rhs.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                          ,0xb0,
                          "SquareMatrix<T> &qclab::dense::SquareMatrix<double>::operator*=(const SquareMatrix<T> &) [T = double]"
                         );
          }
          if (lVar8 == 0) {
            __assert_fail("size > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                          ,0x1e,"auto qclab::dense::init_unique_array(const int64_t) [T = double]");
          }
          uVar21 = -(ulong)((ulong)(lVar8 * lVar8) >> 0x3d != 0) | lVar8 * lVar8 * 8;
          pdVar5 = (double *)operator_new__(uVar21);
          memset(pdVar5,0,uVar21);
          if (0 < lVar8) {
            pdVar7 = (matrix->data_)._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl;
            lVar15 = 0;
            _Var6._M_head_impl =
                 (double *)
                 local_b0.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
            do {
              lVar13 = 0;
              pdVar12 = pdVar7;
              do {
                dVar23 = pdVar5[lVar15 * lVar8 + lVar13];
                lVar16 = 0;
                pdVar14 = pdVar12;
                do {
                  dVar23 = dVar23 + *pdVar14 * _Var6._M_head_impl[lVar16];
                  pdVar5[lVar15 * lVar8 + lVar13] = dVar23;
                  lVar16 = lVar16 + 1;
                  pdVar14 = pdVar14 + lVar8;
                } while (lVar8 != lVar16);
                lVar13 = lVar13 + 1;
                pdVar12 = pdVar12 + 1;
              } while (lVar13 != lVar8);
              lVar15 = lVar15 + 1;
              _Var6._M_head_impl = _Var6._M_head_impl + local_b0.size_;
            } while (lVar15 != lVar8);
          }
          pdVar7 = (matrix->data_)._M_t.
                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl;
          (matrix->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar5;
          if (pdVar7 != (double *)0x0) {
            operator_delete__(pdVar7);
          }
        }
        else {
          iVar4 = ~local_50[0][1] + nbQubits;
          local_80 = CONCAT44(local_80._4_4_,iVar4);
          local_a0 = matrix->size_;
          if (0 < local_a0) {
            lVar8 = (long)(1 << ((byte)iVar4 & 0x1f));
            iVar18 = *local_50[0];
            local_98 = CONCAT44(local_98._4_4_,iVar18);
            uVar10 = 1 << ((byte)iVar18 & 0x1f);
            local_88 = 1;
            if (1 < lVar8) {
              local_88 = lVar8;
            }
            if ((int)uVar10 < 2) {
              uVar10 = 1;
            }
            lVar8 = lVar8 * local_a0;
            lVar15 = lVar8 * 8;
            lVar9 = lVar8 * 0x10;
            lVar13 = lVar8 * 0x18;
            lVar19 = 0;
            lVar16 = 0;
            do {
              local_90 = lVar16;
              if (iVar18 != 0x1f) {
                pdVar5 = (matrix->data_)._M_t.
                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl;
                uVar21 = 0;
                do {
                  lVar16 = local_88;
                  pdVar7 = pdVar5;
                  if (iVar4 != 0x1f) {
                    do {
                      dVar23 = *(double *)((long)pdVar7 + lVar19);
                      dVar1 = *(double *)((long)pdVar7 + lVar15);
                      dVar2 = *(double *)((long)pdVar7 + lVar9);
                      dVar3 = *(double *)((long)pdVar7 + lVar13);
                      *(double *)((long)pdVar7 + lVar19) =
                           *(double *)
                            ((long)local_b0.data_._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18) *
                           dVar3 + *(double *)
                                    ((long)local_b0.data_._M_t.
                                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                           .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                    0x10) * dVar2 +
                                   *(double *)
                                    local_b0.data_._M_t.
                                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                    .super__Head_base<0UL,_double_*,_false>._M_head_impl * dVar23 +
                                   *(double *)
                                    ((long)local_b0.data_._M_t.
                                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                           .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8)
                                   * dVar1;
                      *(double *)((long)pdVar7 + lVar15) =
                           ((double *)
                           ((long)local_b0.data_._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18))
                           [local_b0.size_] * dVar3 +
                           ((double *)
                           ((long)local_b0.data_._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10))
                           [local_b0.size_] * dVar2 +
                           *(double *)
                            ((long)local_b0.data_._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl +
                            local_b0.size_ * 8) * dVar23 +
                           ((double *)
                           ((long)local_b0.data_._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 8))
                           [local_b0.size_] * dVar1;
                      *(double *)((long)pdVar7 + lVar9) =
                           ((double *)
                           ((long)local_b0.data_._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18))
                           [local_b0.size_ * 2] * dVar3 +
                           ((double *)
                           ((long)local_b0.data_._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10))
                           [local_b0.size_ * 2] * dVar2 +
                           *(double *)
                            ((long)local_b0.data_._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl +
                            local_b0.size_ * 0x10) * dVar23 +
                           ((double *)
                           ((long)local_b0.data_._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 8))
                           [local_b0.size_ * 2] * dVar1;
                      *(double *)((long)pdVar7 + lVar13) =
                           dVar3 * ((double *)
                                   ((long)local_b0.data_._M_t.
                                          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                          .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                   0x18))[local_b0.size_ * 3] +
                           dVar2 * ((double *)
                                   ((long)local_b0.data_._M_t.
                                          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                          .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                   0x10))[local_b0.size_ * 3] +
                           dVar23 * *(double *)
                                     ((long)local_b0.data_._M_t.
                                            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                            .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                     local_b0.size_ * 0x18) +
                           dVar1 * ((double *)
                                   ((long)local_b0.data_._M_t.
                                          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                          .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8))
                                   [local_b0.size_ * 3];
                      pdVar7 = pdVar7 + local_a0;
                      lVar16 = lVar16 + -1;
                    } while (lVar16 != 0);
                  }
                  uVar21 = uVar21 + 1;
                  pdVar5 = pdVar5 + lVar8 * 4;
                } while (uVar21 != uVar10);
              }
              lVar19 = lVar19 + 8;
              lVar15 = lVar15 + 8;
              lVar9 = lVar9 + 8;
              lVar13 = lVar13 + 8;
              lVar16 = local_90 + 1;
            } while (local_90 + 1 != local_a0);
          }
        }
      }
      else if (nbQubits == 2) {
        dense::SquareMatrix<double>::SquareMatrix(&local_70,&local_b0);
        dense::operator*((dense *)&local_60,&local_70,matrix);
        dense::SquareMatrix<double>::operator=(matrix,&local_60);
        if (local_60.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
          operator_delete__((void *)local_60.data_._M_t.
                                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                    .super__Head_base<0UL,_double_*,_false>._M_head_impl);
        }
        local_60.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl =
             (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
             (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
        if ((tuple<double_*,_std::default_delete<double[]>_>)
            local_70.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl !=
            (_Head_base<0UL,_double_*,_false>)0x0) {
          operator_delete__((void *)local_70.data_._M_t.
                                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                    .super__Head_base<0UL,_double_*,_false>._M_head_impl);
        }
        local_70.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl =
             (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
             (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
      }
      else {
        uVar10 = local_50[0][1];
        local_98 = matrix->size_;
        if (0 < local_98) {
          local_80 = (long)(1 << ((byte)(~uVar10 + nbQubits) & 0x1f));
          local_74 = *local_50[0];
          uVar11 = 1 << ((byte)local_74 & 0x1f);
          lVar8 = 1;
          if (1 < local_80) {
            lVar8 = local_80;
          }
          if ((int)uVar11 < 2) {
            uVar11 = 1;
          }
          local_38 = local_98 * 8;
          lVar15 = local_80 * 0x20;
          local_88 = local_80 * 8;
          local_90 = local_80 * 0x18;
          local_80 = local_80 << 4;
          local_a0 = 0;
          lVar13 = 0;
          do {
            if (local_74 != 0x1f) {
              pdVar5 = (matrix->data_)._M_t.
                       super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                       super__Head_base<0UL,_double_*,_false>._M_head_impl;
              lVar16 = local_a0 + (long)pdVar5;
              lVar9 = local_88 + (long)pdVar5;
              lVar19 = local_90 + (long)pdVar5;
              lVar17 = (long)pdVar5 + local_80;
              uVar21 = 0;
              do {
                if (~uVar10 + nbQubits != 0x1f) {
                  lVar20 = 0;
                  do {
                    dVar23 = *(double *)(lVar16 + lVar20);
                    dVar1 = *(double *)(lVar9 + lVar20);
                    dVar2 = *(double *)(lVar17 + lVar20);
                    dVar3 = *(double *)(lVar19 + lVar20);
                    *(double *)(lVar16 + lVar20) =
                         *(double *)
                          ((long)local_b0.data_._M_t.
                                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                 super__Head_base<0UL,_double_*,_false>._M_head_impl +
                          local_b0.size_ * 0x18) * dVar3 +
                         *(double *)
                          ((long)local_b0.data_._M_t.
                                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                 super__Head_base<0UL,_double_*,_false>._M_head_impl +
                          local_b0.size_ * 0x10) * dVar2 +
                         *(double *)
                          local_b0.data_._M_t.
                          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                          super__Head_base<0UL,_double_*,_false>._M_head_impl * dVar23 +
                         *(double *)
                          ((long)local_b0.data_._M_t.
                                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                 super__Head_base<0UL,_double_*,_false>._M_head_impl +
                          local_b0.size_ * 8) * dVar1;
                    *(double *)(lVar9 + lVar20) =
                         ((double *)
                         ((long)local_b0.data_._M_t.
                                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                super__Head_base<0UL,_double_*,_false>._M_head_impl + 8))
                         [local_b0.size_ * 3] * dVar3 +
                         ((double *)
                         ((long)local_b0.data_._M_t.
                                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                super__Head_base<0UL,_double_*,_false>._M_head_impl + 8))
                         [local_b0.size_ * 2] * dVar2 +
                         *(double *)
                          ((long)local_b0.data_._M_t.
                                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                 super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) * dVar23 +
                         ((double *)
                         ((long)local_b0.data_._M_t.
                                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                super__Head_base<0UL,_double_*,_false>._M_head_impl + 8))
                         [local_b0.size_] * dVar1;
                    *(double *)(lVar17 + lVar20) =
                         ((double *)
                         ((long)local_b0.data_._M_t.
                                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10))
                         [local_b0.size_ * 3] * dVar3 +
                         ((double *)
                         ((long)local_b0.data_._M_t.
                                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10))
                         [local_b0.size_ * 2] * dVar2 +
                         *(double *)
                          ((long)local_b0.data_._M_t.
                                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                 super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10) *
                         dVar23 + ((double *)
                                  ((long)local_b0.data_._M_t.
                                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                         .super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10
                                  ))[local_b0.size_] * dVar1;
                    *(double *)(lVar19 + lVar20) =
                         dVar3 * ((double *)
                                 ((long)local_b0.data_._M_t.
                                        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                        .super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18)
                                 )[local_b0.size_ * 3] +
                         dVar2 * ((double *)
                                 ((long)local_b0.data_._M_t.
                                        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                        .super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18)
                                 )[local_b0.size_ * 2] +
                         dVar23 * *(double *)
                                   ((long)local_b0.data_._M_t.
                                          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                          .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                   0x18) +
                         dVar1 * ((double *)
                                 ((long)local_b0.data_._M_t.
                                        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                        .super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18)
                                 )[local_b0.size_];
                    lVar20 = lVar20 + 8;
                  } while (lVar8 * 8 != lVar20);
                }
                uVar21 = uVar21 + 1;
                lVar16 = lVar16 + lVar15;
                lVar9 = lVar9 + lVar15;
                lVar19 = lVar19 + lVar15;
                lVar17 = lVar17 + lVar15;
              } while (uVar21 != uVar11);
            }
            lVar13 = lVar13 + 1;
            local_a0 = local_a0 + local_38;
            local_88 = local_88 + local_38;
            local_90 = local_90 + local_38;
            local_80 = local_80 + local_38;
          } while (lVar13 != local_98);
        }
      }
      if ((_Head_base<0UL,_double_*,_false>)
          local_b0.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl !=
          (_Head_base<0UL,_double_*,_false>)0x0) {
        operator_delete__((void *)local_b0.data_._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl);
      }
      if (local_50[0] != (int *)0x0) {
        operator_delete(local_50[0],local_40 - (long)local_50[0]);
      }
      return;
    }
    __assertion = "qubits[1] < nbQubits";
  }
  else {
    __assertion = "qubits[0] < nbQubits";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                ,0x28,
                "virtual void qclab::qgates::QGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
               );
}

Assistant:

void QGate2< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    assert( qubits[0] + 1 == qubits[1] ) ;  // nearest neighbor qubtis
    // operation
    qclab::dense::SquareMatrix< T >  mat2 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat2 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 2 ) {
        matrix *= mat2 ;
      } else {
        // matrix *= kron( Ileft , mat2 , Iright )
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 4 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const int64_t j3 = j2 + nRight ;
              const int64_t j4 = j3 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              const T x3 = matrix(i,j3) ;
              const T x4 = matrix(i,j4) ;
              matrix(i,j1) = mat2(0,0) * x1 + mat2(1,0) * x2 +
                             mat2(2,0) * x3 + mat2(3,0) * x4 ;
              matrix(i,j2) = mat2(0,1) * x1 + mat2(1,1) * x2 +
                             mat2(2,1) * x3 + mat2(3,1) * x4 ;
              matrix(i,j3) = mat2(0,2) * x1 + mat2(1,2) * x2 +
                             mat2(2,2) * x3 + mat2(3,2) * x4 ;
              matrix(i,j4) = mat2(0,3) * x1 + mat2(1,3) * x2 +
                             mat2(2,3) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 2 ) {
        matrix = mat2 * matrix ;
      } else {
        // matrix = kron( Ileft , mat2 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 4 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const int64_t i3 = i2 + nRight ;
              const int64_t i4 = i3 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              const T x3 = matrix(i3,j) ;
              const T x4 = matrix(i4,j) ;
              matrix(i1,j) = mat2(0,0) * x1 + mat2(0,1) * x2 +
                             mat2(0,2) * x3 + mat2(0,3) * x4 ;
              matrix(i2,j) = mat2(1,0) * x1 + mat2(1,1) * x2 +
                             mat2(1,2) * x3 + mat2(1,3) * x4 ;
              matrix(i3,j) = mat2(2,0) * x1 + mat2(2,1) * x2 +
                             mat2(2,2) * x3 + mat2(2,3) * x4 ;
              matrix(i4,j) = mat2(3,0) * x1 + mat2(3,1) * x2 +
                             mat2(3,2) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    }
  }